

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O0

Gia_Man_t * Gia_ManRetimeDupForward(Gia_Man_t *p,Vec_Ptr_t *vCut)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_44;
  Gia_Obj_t *pGStack_40;
  int i;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Ptr_t *vCut_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  Gia_ManSetPhase(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_44 < iVar1) {
      pObjRi = Gia_ManCi(p,local_44);
      bVar6 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pObjRi->Value = uVar2;
    local_44 = local_44 + 1;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCut), local_44 < iVar1; local_44 = local_44 + 1) {
    pObjRi = (Gia_Obj_t *)Vec_PtrEntry(vCut,local_44);
    iVar1 = Gia_ManAppendCi(p_00);
    uVar2 = Abc_LitNotCond(iVar1,(uint)((ulong)*(undefined8 *)pObjRi >> 0x3f));
    pObjRi->Value = uVar2;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar6 = false;
    if (local_44 < iVar1) {
      pObjRi = Gia_ManCo(p,local_44);
      bVar6 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ObjFanin0(pObjRi);
    Gia_ManRetimeDup_rec(p_00,pGVar4);
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar6 = false;
    if (local_44 < iVar1) {
      pObjRi = Gia_ManCo(p,local_44);
      bVar6 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Gia_ObjFanin0Copy(pObjRi);
    Gia_ManAppendCo(p_00,iVar1);
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_44 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRi = Gia_ManCo(p,iVar1 + local_44);
      bVar6 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ObjFanin0Copy(pObjRi);
    pObjRi->Value = uVar2;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_44 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRo = Gia_ManCo(p,iVar1 + local_44);
      bVar6 = false;
      if (pObjRo != (Gia_Obj_t *)0x0) {
        iVar1 = Gia_ManPiNum(p);
        pGStack_40 = Gia_ManCi(p,iVar1 + local_44);
        bVar6 = pGStack_40 != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar6) break;
    pGStack_40->Value = pObjRo->Value;
    local_44 = local_44 + 1;
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCut), local_44 < iVar1; local_44 = local_44 + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vCut,local_44);
    iVar1 = Gia_ObjIsAnd(pGVar4);
    if (iVar1 != 0) {
      pGVar4->Value = 0xffffffff;
    }
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(vCut), local_44 < iVar1; local_44 = local_44 + 1) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vCut,local_44);
    Gia_ManRetimeDup_rec(p_00,pGVar4);
    iVar1 = Abc_LitNotCond(pGVar4->Value,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f));
    Gia_ManAppendCo(p_00,iVar1);
  }
  Gia_ManHashStop(p_00);
  iVar1 = Vec_PtrSize(vCut);
  Gia_ManSetRegNum(p_00,iVar1);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManRetimeDupForward( Gia_Man_t * p, Vec_Ptr_t * vCut )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // create the true PIs
    Gia_ManFillValue( p );
    Gia_ManSetPhase( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), pObj->fPhase );
    // duplicate logic above the cut
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManRetimeDup_rec( pNew, Gia_ObjFanin0(pObj) );
    // create the true POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // remember value in LI
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // transfer values from the LIs to the LOs
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
        pObjRo->Value = pObjRi->Value;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = ~0;
    // duplicate logic below the cut
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
    {
        Gia_ManRetimeDup_rec( pNew, pObj );
        Gia_ManAppendCo( pNew, Abc_LitNotCond( pObj->Value, pObj->fPhase ) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vCut) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}